

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteDoubleArray
               (double *a,int n,CodedOutputStream *output)

{
  uint size;
  uint8_t *puVar1;
  
  size = n << 3;
  puVar1 = output->cur_;
  if ((long)(output->impl_).end_ - (long)puVar1 < (long)(int)size) {
    puVar1 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,a,size,puVar1);
  }
  else {
    memcpy(puVar1,a,(ulong)size);
    puVar1 = puVar1 + (int)size;
  }
  output->cur_ = puVar1;
  return;
}

Assistant:

void WireFormatLite::WriteDoubleArray(const double* a, int n,
                                      io::CodedOutputStream* output) {
  WriteArray<double>(a, n, output);
}